

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O1

void __thiscall
soplex::SPxBasisBase<double>::coSolve
          (SPxBasisBase<double> *this,VectorBase<double> *x,VectorBase<double> *rhs)

{
  pointer __s;
  pointer pdVar1;
  
  if ((int)((ulong)((long)(rhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(rhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    if (this->factorized == false) {
      factorize(this);
    }
    (*this->factor->_vptr_SLinSolver[0x14])(this->factor,x,rhs);
    return;
  }
  __s = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start;
  pdVar1 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar1) {
    memset(__s,0,(long)pdVar1 - (long)__s & 0xfffffffffffffff8);
    return;
  }
  return;
}

Assistant:

void coSolve(VectorBase<R>& x, const VectorBase<R>& rhs)
   {
      if(rhs.dim() == 0)
      {
         x.clear();
         return;
      }

      if(!factorized)
         SPxBasisBase<R>::factorize();

      factor->solveLeft(x, rhs);
   }